

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  byte bVar2;
  params *ppVar3;
  uint64 uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint64 (*pauVar14) [3];
  int iVar15;
  int iVar16;
  int iVar17;
  uint16 r;
  uint uVar18;
  ushort uVar19;
  uint16 color0;
  uint uVar20;
  ulong uVar21;
  uint64 (*pauVar22) [3];
  short sVar23;
  color_quad_u8 *pcVar24;
  uint64 s;
  uint16 g;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  uint uVar42;
  uint uVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  undefined1 local_118 [16];
  color_quad_u8 block_colors [4];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  
  uVar36 = (uint)(high_color->m_s[0] * 32.0);
  uVar37 = (uint)(low_color->m_s[1] * 64.0);
  uVar42 = -(uint)((int)uVar36 < 0x1f);
  uVar45 = -(uint)((int)uVar37 < 0x3f);
  uVar42 = ~uVar42 & 0x1f | uVar36 & uVar42;
  uVar36 = ~uVar45 & 0x3f | uVar37 & uVar45;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar38._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 0xb;
  auVar39._4_4_ = uVar36 << 0xb;
  auVar39._0_4_ = auVar38._0_4_;
  auVar39._8_4_ = auVar39._4_4_;
  auVar39._12_4_ = uVar36 << 5;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._4_4_ = uVar36 << 5;
  uVar36 = (uint)(high_color->m_s[1] * 64.0);
  uVar37 = (uint)(low_color->m_s[0] * 32.0);
  uVar42 = -(uint)((int)uVar36 < 0x3f);
  uVar45 = -(uint)((int)uVar37 < 0x1f);
  uVar42 = ~uVar42 & 0x3f | uVar36 & uVar42;
  uVar36 = ~uVar45 & 0x1f | uVar37 & uVar45;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar40._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 5;
  auVar41._4_4_ = uVar36 << 5;
  auVar41._0_4_ = auVar40._0_4_;
  auVar41._8_4_ = auVar41._4_4_;
  auVar41._12_4_ = uVar36 << 0xb;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40._4_4_ = uVar36 << 0xb;
  auVar44._0_4_ = (int)(high_color->m_s[2] * 32.0);
  auVar44._4_4_ = (int)(low_color->m_s[2] * 32.0);
  auVar44._8_8_ = 0;
  auVar43._0_4_ = -(uint)(auVar44._0_4_ < (int)DAT_00195320);
  auVar43._4_4_ = -(uint)(auVar44._4_4_ < DAT_00195320._4_4_);
  auVar43._8_4_ = -(uint)(0 < DAT_00195320._8_4_);
  auVar43._12_4_ = -(uint)(0 < DAT_00195320._12_4_);
  auVar44 = ~auVar43 & _DAT_00195320 | auVar44 & auVar43;
  auVar35._0_4_ = -(uint)(0 < auVar44._0_4_);
  auVar35._4_4_ = -(uint)(0 < auVar44._4_4_);
  auVar35._8_4_ = -(uint)(0 < auVar44._8_4_);
  auVar35._12_4_ = -(uint)(0 < auVar44._12_4_);
  auVar44 = auVar35 & auVar44 | auVar40 | auVar38;
  hist[2] = 0;
  hist[3] = 0;
  hist[0] = 0;
  hist[1] = 0;
  D2[3][1] = 0;
  D2[3][2] = 0;
  D2[2][2] = 0;
  D2[3][0] = 0;
  D2[2][0] = 0;
  D2[2][1] = 0;
  D2[1][1] = 0;
  D2[1][2] = 0;
  D2[0][2] = 0;
  D2[1][0] = 0;
  D2[0][0] = 0;
  D2[0][1] = 0;
  DD[3][1] = 0;
  DD[3][2] = 0;
  DD[2][2] = 0;
  DD[3][0] = 0;
  DD[2][0] = 0;
  DD[2][1] = 0;
  DD[1][1] = 0;
  DD[1][2] = 0;
  DD[0][2] = 0;
  DD[1][0] = 0;
  DD[0][0] = 0;
  DD[0][1] = 0;
  ppVar3 = this->m_pParams;
  uVar36 = ppVar3->m_num_pixels;
  lVar13 = 0;
  for (uVar21 = 0; uVar21 != uVar36; uVar21 = uVar21 + 1) {
    bVar1 = ppVar3->m_pSelectors[uVar21];
    pcVar24 = ppVar3->m_pPixels;
    hist[bVar1] = hist[bVar1] + 1;
    for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
      bVar2 = (pcVar24->field_0).c[lVar28 + lVar13];
      D2[bVar1][lVar28] = D2[bVar1][lVar28] + (ulong)((uint)bVar2 * 2);
      DD[bVar1][lVar28] = DD[bVar1][lVar28] + (ulong)bVar2 * (ulong)bVar2;
    }
    lVar13 = lVar13 + 4;
  }
  local_118 = pshuflw(auVar44,auVar44,0xe8);
  vector<unsigned_int>::vector(&solutions,0x36);
  uVar21 = hist[2] + hist[0];
  uVar11 = hist[3] + hist[1];
  bVar10 = true;
  iVar8 = 8;
  while( true ) {
    bVar34 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if ((!bVar10) || (bVar34)) break;
    uVar5 = local_118._2_2_;
    uVar42 = uVar5 >> 5 & 0x3f;
    uVar37 = (uint)uVar5;
    uVar12 = 0;
    sVar23 = (short)(uVar5 & 0x1f);
    uVar36 = (uint)(ushort)(sVar23 - 1);
    if (sVar23 == 0) {
      uVar36 = 0;
    }
    sVar23 = (short)uVar42;
    uVar45 = (uint)(ushort)(sVar23 - 1);
    if (sVar23 == 0) {
      uVar45 = 0;
    }
    uVar19 = ((uVar5 >> 0xb) - 1) + (ushort)(uVar5 < 0x800);
    uVar6 = local_118._0_2_;
    uVar29 = (uint)uVar19 << 0xb | uVar36 | uVar45 << 5;
    iVar15 = uVar37 - uVar29;
    uVar25 = (uint)uVar6 * 0x10000 + uVar29;
    for (; (uVar36 <= (uVar5 & 0x1f) + 1 &&
           (uVar20 = uVar29, iVar16 = iVar15, uVar26 = uVar45, uVar32 = uVar25, uVar36 < 0x20));
        uVar36 = uVar36 + 1) {
      for (; (uVar26 <= uVar42 + 1 &&
             (uVar18 = (uint)uVar19, uVar27 = uVar32, uVar7 = uVar20, iVar17 = iVar16, uVar26 < 0x40
             )); uVar26 = uVar26 + 1) {
        for (; (uVar18 <= (uVar5 >> 0xb) + 1 && (uVar18 < 0x20)); uVar18 = uVar18 + 1) {
          uVar31 = uVar12;
          if (iVar17 != 0) {
            uVar30 = uVar27 << 0x10 | uVar27 >> 0x10;
            if (uVar6 <= uVar7 && uVar7 != uVar6) {
              uVar30 = uVar27;
            }
            uVar31 = (ulong)((int)uVar12 + 1);
            solutions.m_p[uVar12] = uVar30;
          }
          uVar12 = uVar31;
          uVar27 = uVar27 + 0x800;
          uVar7 = uVar7 + 0x800;
          iVar17 = iVar17 + -0x800;
        }
        uVar20 = uVar20 + 0x20;
        iVar16 = iVar16 + -0x20;
        uVar32 = uVar32 + 0x20;
      }
      uVar29 = uVar29 + 1;
      iVar15 = iVar15 + -1;
      uVar25 = uVar25 + 1;
    }
    uVar36 = uVar6 & 0x1f;
    uVar42 = uVar6 >> 5 & 0x3f;
    sVar23 = (short)uVar36;
    uVar45 = (uint)(ushort)(sVar23 - 1);
    if (sVar23 == 0) {
      uVar45 = 0;
    }
    sVar23 = (short)uVar42;
    uVar29 = (uint)(ushort)(sVar23 - 1);
    if (sVar23 == 0) {
      uVar29 = 0;
    }
    uVar19 = ((uVar6 >> 0xb) - 1) + (ushort)(uVar6 < 0x800);
    uVar32 = (uint)uVar19 << 0xb | uVar45 | uVar29 << 5;
    iVar15 = uVar6 - uVar32;
    uVar25 = uVar37 * 0x10000 + uVar32;
    for (; (uVar45 <= uVar36 + 1 &&
           (uVar26 = uVar32, uVar27 = uVar29, iVar16 = iVar15, uVar20 = uVar25, uVar45 < 0x20));
        uVar45 = uVar45 + 1) {
      for (; (uVar27 <= uVar42 + 1 &&
             (uVar18 = (uint)uVar19, uVar7 = uVar26, iVar17 = iVar16, uVar30 = uVar20, uVar27 < 0x40
             )); uVar27 = uVar27 + 1) {
        for (; (uVar18 <= (uVar6 >> 0xb) + 1 && (uVar18 < 0x20)); uVar18 = uVar18 + 1) {
          uVar31 = uVar12;
          if (iVar17 != 0) {
            uVar33 = uVar30 << 0x10 | uVar30 >> 0x10;
            if (uVar37 <= uVar7 && uVar7 != uVar5) {
              uVar33 = uVar30;
            }
            uVar31 = (ulong)((int)uVar12 + 1);
            solutions.m_p[uVar12] = uVar33;
          }
          uVar12 = uVar31;
          uVar7 = uVar7 + 0x800;
          iVar17 = iVar17 + -0x800;
          uVar30 = uVar30 + 0x800;
        }
        uVar26 = uVar26 + 0x20;
        iVar16 = iVar16 + -0x20;
        uVar20 = uVar20 + 0x20;
      }
      uVar32 = uVar32 + 1;
      iVar15 = iVar15 + -1;
      uVar25 = uVar25 + 1;
    }
    std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (solutions.m_p,solutions.m_p + uVar12);
    bVar10 = false;
    for (uVar31 = 0; pcVar24 = block_colors, uVar31 != uVar12; uVar31 = uVar31 + 1) {
      if (uVar31 == 0) {
        uVar36 = *solutions.m_p;
LAB_00189555:
        uVar37 = uVar36 >> 0x10;
        if ((uVar36 & 0xffff) == uVar37) {
          if (uVar11 < uVar21) {
            uVar42 = (uint)((short)uVar36 == 0);
            if ((uVar36 & 0x1f0000) == 0) {
              iVar15 = -0x800;
              if (uVar36 < 0x8000000) {
                iVar15 = (uint)(uVar36 < 0x10000) * 0x20 + -0x20;
              }
            }
            else {
              iVar15 = -1;
            }
          }
          else {
            uVar45 = ~uVar36;
            uVar42 = 1;
            if (((uVar45 & 0x1f) == 0) && (uVar42 = 0x800, (uVar45 & 0xf800) == 0)) {
              uVar42 = (uint)((uVar45 & 0x7e0) != 0) << 5;
            }
            iVar15 = -(uint)(uVar37 == 0xffff);
          }
          uVar36 = uVar42 + uVar36;
          uVar37 = uVar37 + iVar15;
        }
        color0 = (uint16)uVar36;
        dxt1_block::get_block_colors4(pcVar24,color0,(uint16)uVar37);
        bVar34 = this->m_pParams->m_perceptual;
        pauVar14 = D2;
        pauVar22 = DD;
        uVar9 = 0;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          uVar4 = hist[lVar13];
          for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
            d[lVar28] = (uVar4 * (pcVar24->field_0).c[lVar28] - (*pauVar14)[lVar28]) *
                        (ulong)(pcVar24->field_0).c[lVar28] + (*pauVar22)[lVar28];
          }
          if (bVar34 == false) {
            lVar28 = d[0] + d[1];
          }
          else {
            lVar28 = d[1] * 0x19 + d[0] * 8;
          }
          uVar9 = uVar9 + lVar28 + d[2];
          pcVar24 = pcVar24 + 1;
          pauVar22 = pauVar22 + 1;
          pauVar14 = pauVar14 + 1;
        }
        if (uVar9 < this->m_pResults->m_error) {
          this->m_pResults->m_low_color = color0;
          this->m_pResults->m_high_color = (uint16)uVar37;
          this->m_pResults->m_error = uVar9;
          if (this->m_pResults->m_error == 0) goto LAB_0018970f;
          local_118._8_8_ = 0;
          local_118._0_8_ = (ulong)uVar37 & 0xffffffff0000ffff | (ulong)color0 << 0x10;
          bVar10 = true;
        }
      }
      else {
        uVar36 = solutions.m_p[uVar31];
        if (uVar36 != solutions.m_p[uVar31 - 1]) goto LAB_00189555;
      }
    }
  }
LAB_0018970f:
  vector<unsigned_int>::~vector(&solutions);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color) {
  uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
  uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

  uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
  for (uint i = 0; i < m_pParams->m_num_pixels; i++) {
    const color_quad_u8& pixel = m_pParams->m_pPixels[i];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    for (uint c = 0; c < 3; c++) {
      D2[s][c] += pixel[c] * 2;
      DD[s][c] += pixel[c] * pixel[c];
    }
  }
  crnlib::vector<uint> solutions(54);
  bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
  bool improved = true;

  for (uint iterations = 8; improved && iterations; iterations--) {
    improved = false;
    uint solutions_count = 0;
    for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 L = r << 11 | g << 5 | b;
          if (L != L0)
            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
        }
      }
    }
    for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 H = r << 11 | g << 5 | b;
          if (H != H0)
            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
        }
      }
    }
    std::sort(solutions.begin(), solutions.begin() + solutions_count);
    for (uint i = 0; i < solutions_count; i++) {
      if (i && solutions[i] == solutions[i - 1])
        continue;
      uint16 L = solutions[i] & 0xFFFF;
      uint16 H = solutions[i] >> 16;
      if (L == H) {
        L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800 : ~L & 0x7E0 ? 0x20 : 0 : !L ? 0x1 : 0;
        H -= preserveL ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800 : H & 0x7E0 ? 0x20 : 0 : H == 0xFFFF ? 0x1 : 0;
      }
      color_quad_u8 block_colors[4];
      dxt1_block::get_block_colors4(block_colors, L, H);
      uint64 error = 0;
      for (uint64 s = 0, d[3]; s < 4; s++) {
        for (uint c = 0; c < 3; c++)
          d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
        error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
      }
      if (error < m_pResults->m_error) {
        m_pResults->m_low_color = L0 = L;
        m_pResults->m_high_color = H0 = H;
        m_pResults->m_error = error;
        if (!m_pResults->m_error)
          return;
        improved = true;
      }
    }
  }
}